

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvm(LlvmCompilationContext *ctx,ExprBase *expression)

{
  ExprBase *expression_local;
  LlvmCompilationContext *ctx_local;
  
  switch(expression->typeID) {
  case 2:
    ctx_local = (LlvmCompilationContext *)CompileLlvmVoid(ctx,(ExprVoid *)expression);
    break;
  case 3:
    ctx_local = (LlvmCompilationContext *)CompileLlvmBoolLiteral(ctx,(ExprBoolLiteral *)expression);
    break;
  case 4:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmCharacterLiteral(ctx,(ExprCharacterLiteral *)expression);
    break;
  case 5:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmStringLiteral(ctx,(ExprStringLiteral *)expression);
    break;
  case 6:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmIntegerLiteral(ctx,(ExprIntegerLiteral *)expression);
    break;
  case 7:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmRationalLiteral(ctx,(ExprRationalLiteral *)expression);
    break;
  case 8:
    ctx_local = (LlvmCompilationContext *)CompileLlvmTypeLiteral(ctx,(ExprTypeLiteral *)expression);
    break;
  case 9:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmNullptrLiteral(ctx,(ExprNullptrLiteral *)expression);
    break;
  case 10:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmFunctionIndexLiteral(ctx,(ExprFunctionIndexLiteral *)expression);
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x8ef,"LLVMValueRef CompileLlvm(LlvmCompilationContext &, ExprBase *)");
  case 0xe:
    ctx_local = (LlvmCompilationContext *)CompileLlvmPassthrough(ctx,(ExprPassthrough *)expression);
    break;
  case 0xf:
    ctx_local = (LlvmCompilationContext *)CompileLlvmArray(ctx,(ExprArray *)expression);
    break;
  case 0x10:
    ctx_local = (LlvmCompilationContext *)CompileLlvmPreModify(ctx,(ExprPreModify *)expression);
    break;
  case 0x11:
    ctx_local = (LlvmCompilationContext *)CompileLlvmPostModify(ctx,(ExprPostModify *)expression);
    break;
  case 0x12:
    ctx_local = (LlvmCompilationContext *)CompileLlvmTypeCast(ctx,(ExprTypeCast *)expression);
    break;
  case 0x13:
    ctx_local = (LlvmCompilationContext *)CompileLlvmUnaryOp(ctx,(ExprUnaryOp *)expression);
    break;
  case 0x14:
    ctx_local = (LlvmCompilationContext *)CompileLlvmBinaryOp(ctx,(ExprBinaryOp *)expression);
    break;
  case 0x15:
    ctx_local = (LlvmCompilationContext *)CompileLlvmGetAddress(ctx,(ExprGetAddress *)expression);
    break;
  case 0x16:
    ctx_local = (LlvmCompilationContext *)CompileLlvmDereference(ctx,(ExprDereference *)expression);
    break;
  case 0x17:
    ctx_local = (LlvmCompilationContext *)CompileLlvmUnboxing(ctx,(ExprUnboxing *)expression);
    break;
  case 0x18:
    ctx_local = (LlvmCompilationContext *)CompileLlvmConditional(ctx,(ExprConditional *)expression);
    break;
  case 0x19:
    ctx_local = (LlvmCompilationContext *)CompileLlvmAssignment(ctx,(ExprAssignment *)expression);
    break;
  case 0x1a:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmMemberAccess(ctx,(ExprMemberAccess *)expression);
    break;
  case 0x1b:
    ctx_local = (LlvmCompilationContext *)CompileLlvmArrayIndex(ctx,(ExprArrayIndex *)expression);
    break;
  case 0x1c:
    ctx_local = (LlvmCompilationContext *)CompileLlvmReturn(ctx,(ExprReturn *)expression);
    break;
  case 0x1d:
    ctx_local = (LlvmCompilationContext *)CompileLlvmYield(ctx,(ExprYield *)expression);
    break;
  case 0x1e:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmVariableDefinition(ctx,(ExprVariableDefinition *)expression);
    break;
  case 0x1f:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmZeroInitialize(ctx,(ExprZeroInitialize *)expression);
    break;
  case 0x20:
    ctx_local = (LlvmCompilationContext *)CompileLlvmArraySetup(ctx,(ExprArraySetup *)expression);
    break;
  case 0x21:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmVariableDefinitions(ctx,(ExprVariableDefinitions *)expression);
    break;
  case 0x22:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmVariableAccess(ctx,(ExprVariableAccess *)expression);
    break;
  case 0x23:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmFunctionContextAccess(ctx,(ExprFunctionContextAccess *)expression);
    break;
  case 0x24:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmFunctionDefinition(ctx,(ExprFunctionDefinition *)expression);
    break;
  case 0x25:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmGenericFunctionPrototype(ctx,(ExprGenericFunctionPrototype *)expression);
    break;
  case 0x26:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmFunctionAccess(ctx,(ExprFunctionAccess *)expression);
    break;
  case 0x29:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmFunctionCall(ctx,(ExprFunctionCall *)expression);
    break;
  case 0x2a:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmAliasDefinition(ctx,(ExprAliasDefinition *)expression);
    break;
  case 0x2b:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmClassPrototype(ctx,(ExprClassPrototype *)expression);
    break;
  case 0x2c:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmGenericClassPrototype(ctx,(ExprGenericClassPrototype *)expression);
    break;
  case 0x2d:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmClassDefinition(ctx,(ExprClassDefinition *)expression);
    break;
  case 0x2e:
    ctx_local = (LlvmCompilationContext *)
                CompileLlvmEnumDefinition(ctx,(ExprEnumDefinition *)expression);
    break;
  case 0x2f:
    ctx_local = (LlvmCompilationContext *)CompileLlvmIfElse(ctx,(ExprIfElse *)expression);
    break;
  case 0x30:
    ctx_local = (LlvmCompilationContext *)CompileLlvmFor(ctx,(ExprFor *)expression);
    break;
  case 0x31:
    ctx_local = (LlvmCompilationContext *)CompileLlvmWhile(ctx,(ExprWhile *)expression);
    break;
  case 0x32:
    ctx_local = (LlvmCompilationContext *)CompileLlvmDoWhile(ctx,(ExprDoWhile *)expression);
    break;
  case 0x33:
    ctx_local = (LlvmCompilationContext *)CompileLlvmSwitch(ctx,(ExprSwitch *)expression);
    break;
  case 0x34:
    ctx_local = (LlvmCompilationContext *)CompileLlvmBreak(ctx,(ExprBreak *)expression);
    break;
  case 0x35:
    ctx_local = (LlvmCompilationContext *)CompileLlvmContinue(ctx,(ExprContinue *)expression);
    break;
  case 0x36:
    ctx_local = (LlvmCompilationContext *)CompileLlvmBlock(ctx,(ExprBlock *)expression);
    break;
  case 0x37:
    ctx_local = (LlvmCompilationContext *)CompileLlvmSequence(ctx,(ExprSequence *)expression);
  }
  return (LLVMValueRef)ctx_local;
}

Assistant:

LLVMValueRef CompileLlvm(LlvmCompilationContext &ctx, ExprBase *expression)
{
	switch(expression->typeID)
	{
	case ExprVoid::myTypeID:
		return CompileLlvmVoid(ctx, (ExprVoid*)expression);
	case ExprBoolLiteral::myTypeID:
		return CompileLlvmBoolLiteral(ctx, (ExprBoolLiteral*)expression);
	case ExprCharacterLiteral::myTypeID:
		return CompileLlvmCharacterLiteral(ctx, (ExprCharacterLiteral*)expression);
	case ExprStringLiteral::myTypeID:
		return CompileLlvmStringLiteral(ctx, (ExprStringLiteral*)expression);
	case ExprIntegerLiteral::myTypeID:
		return CompileLlvmIntegerLiteral(ctx, (ExprIntegerLiteral*)expression);
	case ExprRationalLiteral::myTypeID:
		return CompileLlvmRationalLiteral(ctx, (ExprRationalLiteral*)expression);
	case ExprTypeLiteral::myTypeID:
		return CompileLlvmTypeLiteral(ctx, (ExprTypeLiteral*)expression);
	case ExprNullptrLiteral::myTypeID:
		return CompileLlvmNullptrLiteral(ctx, (ExprNullptrLiteral*)expression);
	case ExprFunctionIndexLiteral::myTypeID:
		return CompileLlvmFunctionIndexLiteral(ctx, (ExprFunctionIndexLiteral*)expression);
	case ExprPassthrough::myTypeID:
		return CompileLlvmPassthrough(ctx, (ExprPassthrough*)expression);
	case ExprArray::myTypeID:
		return CompileLlvmArray(ctx, (ExprArray*)expression);
	case ExprPreModify::myTypeID:
		return CompileLlvmPreModify(ctx, (ExprPreModify*)expression);
	case ExprPostModify::myTypeID:
		return CompileLlvmPostModify(ctx, (ExprPostModify*)expression);
	case ExprTypeCast::myTypeID:
		return CompileLlvmTypeCast(ctx, (ExprTypeCast*)expression);
	case ExprUnaryOp::myTypeID:
		return CompileLlvmUnaryOp(ctx, (ExprUnaryOp*)expression);
	case ExprBinaryOp::myTypeID:
		return CompileLlvmBinaryOp(ctx, (ExprBinaryOp*)expression);
	case ExprGetAddress::myTypeID:
		return CompileLlvmGetAddress(ctx, (ExprGetAddress*)expression);
	case ExprDereference::myTypeID:
		return CompileLlvmDereference(ctx, (ExprDereference*)expression);
	case ExprUnboxing::myTypeID:
		return CompileLlvmUnboxing(ctx, (ExprUnboxing*)expression);
	case ExprConditional::myTypeID:
		return CompileLlvmConditional(ctx, (ExprConditional*)expression);
	case ExprAssignment::myTypeID:
		return CompileLlvmAssignment(ctx, (ExprAssignment*)expression);
	case ExprMemberAccess::myTypeID:
		return CompileLlvmMemberAccess(ctx, (ExprMemberAccess*)expression);
	case ExprArrayIndex::myTypeID:
		return CompileLlvmArrayIndex(ctx, (ExprArrayIndex*)expression);
	case ExprReturn::myTypeID:
		return CompileLlvmReturn(ctx, (ExprReturn*)expression);
	case ExprYield::myTypeID:
		return CompileLlvmYield(ctx, (ExprYield*)expression);
	case ExprVariableDefinition::myTypeID:
		return CompileLlvmVariableDefinition(ctx, (ExprVariableDefinition*)expression);
	case ExprZeroInitialize::myTypeID:
		return CompileLlvmZeroInitialize(ctx, (ExprZeroInitialize*)expression);
	case ExprArraySetup::myTypeID:
		return CompileLlvmArraySetup(ctx, (ExprArraySetup*)expression);
	case ExprVariableDefinitions::myTypeID:
		return CompileLlvmVariableDefinitions(ctx, (ExprVariableDefinitions*)expression);
	case ExprVariableAccess::myTypeID:
		return CompileLlvmVariableAccess(ctx, (ExprVariableAccess*)expression);
	case ExprFunctionContextAccess::myTypeID:
		return CompileLlvmFunctionContextAccess(ctx, (ExprFunctionContextAccess*)expression);
	case ExprFunctionDefinition::myTypeID:
		return CompileLlvmFunctionDefinition(ctx, (ExprFunctionDefinition*)expression);
	case ExprGenericFunctionPrototype::myTypeID:
		return CompileLlvmGenericFunctionPrototype(ctx, (ExprGenericFunctionPrototype*)expression);
	case ExprFunctionAccess::myTypeID:
		return CompileLlvmFunctionAccess(ctx, (ExprFunctionAccess*)expression);
	case ExprFunctionCall::myTypeID:
		return CompileLlvmFunctionCall(ctx, (ExprFunctionCall*)expression);
	case ExprAliasDefinition::myTypeID:
		return CompileLlvmAliasDefinition(ctx, (ExprAliasDefinition*)expression);
	case ExprClassPrototype::myTypeID:
		return CompileLlvmClassPrototype(ctx, (ExprClassPrototype*)expression);
	case ExprGenericClassPrototype::myTypeID:
		return CompileLlvmGenericClassPrototype(ctx, (ExprGenericClassPrototype*)expression);
	case ExprClassDefinition::myTypeID:
		return CompileLlvmClassDefinition(ctx, (ExprClassDefinition*)expression);
	case ExprEnumDefinition::myTypeID:
		return CompileLlvmEnumDefinition(ctx, (ExprEnumDefinition*)expression);
	case ExprIfElse::myTypeID:
		return CompileLlvmIfElse(ctx, (ExprIfElse*)expression);
	case ExprFor::myTypeID:
		return CompileLlvmFor(ctx, (ExprFor*)expression);
	case ExprWhile::myTypeID:
		return CompileLlvmWhile(ctx, (ExprWhile*)expression);
	case ExprDoWhile::myTypeID:
		return CompileLlvmDoWhile(ctx, (ExprDoWhile*)expression);
	case ExprSwitch::myTypeID:
		return CompileLlvmSwitch(ctx, (ExprSwitch*)expression);
	case ExprBreak::myTypeID:
		return CompileLlvmBreak(ctx, (ExprBreak*)expression);
	case ExprContinue::myTypeID:
		return CompileLlvmContinue(ctx, (ExprContinue*)expression);
	case ExprBlock::myTypeID:
		return CompileLlvmBlock(ctx, (ExprBlock*)expression);
	case ExprSequence::myTypeID:
		return CompileLlvmSequence(ctx, (ExprSequence*)expression);
	}

	assert(!"unknown type");

	return NULL;
}